

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

void __thiscall Helper::GenerateRandomPermutations(Helper *this,int n_p,int n_d,int count)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  time_t tVar5;
  int iVar6;
  pointer piVar7;
  long lVar8;
  ulong local_8b8;
  ofstream output_file_pb;
  ios_base aiStack_7c0 [264];
  ulong local_6b8;
  ofstream output_file_db;
  ios_base aiStack_5c0 [264];
  ulong local_4b8;
  ofstream output_file_da;
  ios_base aiStack_3c0 [264];
  ulong local_2b8;
  ofstream output_file_pa;
  ios_base aiStack_1c0 [264];
  time_t local_b8;
  time_t t;
  vector<int,_std::allocator<int>_> flags_p;
  vector<int,_std::allocator<int>_> flags_d;
  vector<int,_std::allocator<int>_> pi_p;
  vector<int,_std::allocator<int>_> pi_d;
  ostream_iterator<int,_char,_std::char_traits<char>_> local_48;
  uint local_34;
  
  local_2b8 = local_2b8 & 0xffffffff00000000;
  local_34 = count;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(long)n_p,(value_type *)&local_2b8,(allocator_type *)&local_4b8);
  local_2b8 = local_2b8 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&t,(long)n_p,(value_type *)&local_2b8,
             (allocator_type *)&local_4b8);
  local_2b8 = local_2b8 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(long)n_d,(value_type *)&local_2b8,(allocator_type *)&local_4b8);
  local_2b8 = local_2b8 & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(long)n_d,(value_type *)&local_2b8,(allocator_type *)&local_4b8);
  std::ofstream::ofstream(&local_2b8,"../randoms/alice/Permutations_PA.txt",_S_out);
  std::ofstream::ofstream(&local_4b8,"../randoms/alice/Permutations_DA.txt",_S_out);
  std::ofstream::ofstream(&local_8b8,"../randoms/bob/Permutations_PB.txt",_S_out);
  std::ofstream::ofstream(&local_6b8,"../randoms/bob/Permutations_DB.txt",_S_out);
  tVar5 = time(&local_b8);
  srand((uint)tVar5);
  if (0 < (int)local_34) {
    uVar3 = 1;
    if (1 < (int)(local_34 * 2)) {
      uVar3 = local_34 * 2;
    }
    local_34 = 0;
    do {
      if (0 < n_p) {
        iVar6 = 0;
        do {
          iVar4 = rand();
          iVar4 = iVar4 % n_p;
          if (*(int *)(t + (long)iVar4 * 4) == 0) {
            *(undefined4 *)(t + (long)iVar4 * 4) = 1;
            flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage[iVar6] = iVar4;
            iVar6 = iVar6 + 1;
          }
        } while (iVar6 < n_p);
      }
      if (0 < n_d) {
        iVar6 = 0;
        do {
          iVar4 = rand();
          iVar4 = iVar4 % n_d;
          if (flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage[iVar4] == 0) {
            flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage[iVar4] = 1;
            pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage[iVar6] = iVar4;
            iVar6 = iVar6 + 1;
          }
        } while (iVar6 < n_d);
      }
      if ((local_34 & 1) == 0) {
        local_48._M_stream = (ostream_type *)&local_2b8;
        local_48._M_string = " ";
        lVar8 = (long)pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage >> 2;
        if (0 < lVar8) {
          lVar8 = lVar8 + 1;
          piVar7 = flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          do {
            std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=(&local_48,piVar7);
            piVar7 = piVar7 + 1;
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        local_48._M_stream = (ostream_type *)&local_4b8;
        local_48._M_string = " ";
        lVar8 = (long)pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage >> 2;
        if (0 < lVar8) {
          lVar8 = lVar8 + 1;
          piVar7 = pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          do {
            std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=(&local_48,piVar7);
            piVar7 = piVar7 + 1;
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        std::ios::widen((char)*(undefined8 *)(local_2b8 - 0x18) + (char)&local_2b8);
        std::ostream::put((char)&local_2b8);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(local_4b8 - 0x18) + (char)&local_4b8);
        std::ostream::put((char)&local_4b8);
        std::ostream::flush();
        std::ostream::flush();
      }
      else {
        local_48._M_stream = (ostream_type *)&local_8b8;
        local_48._M_string = " ";
        lVar8 = (long)pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage >> 2;
        if (0 < lVar8) {
          lVar8 = lVar8 + 1;
          piVar7 = flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          do {
            std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=(&local_48,piVar7);
            piVar7 = piVar7 + 1;
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        local_48._M_stream = (ostream_type *)&local_6b8;
        local_48._M_string = " ";
        lVar8 = (long)pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage >> 2;
        if (0 < lVar8) {
          lVar8 = lVar8 + 1;
          piVar7 = pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          do {
            std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=(&local_48,piVar7);
            piVar7 = piVar7 + 1;
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        std::ios::widen((char)*(undefined8 *)(local_8b8 - 0x18) + (char)&local_8b8);
        std::ostream::put((char)&local_8b8);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(local_6b8 - 0x18) + (char)&local_6b8);
        std::ostream::put((char)&local_6b8);
        std::ostream::flush();
        std::ostream::flush();
      }
      std::ostream::flush();
      if ((pointer)t !=
          flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        memset((void *)t,0,
               ((long)flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + (-4 - t) & 0xfffffffffffffffcU) + 4);
      }
      if (flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage !=
          flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        memset(flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage,0,
               ((long)flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start +
                (-4 - (long)flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) & 0xfffffffffffffffcU) + 4);
      }
      local_34 = local_34 + 1;
    } while (local_34 != uVar3);
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  uVar2 = __filebuf;
  uVar1 = _VTT;
  local_6b8 = _VTT;
  *(undefined8 *)((long)&local_6b8 + *(long *)(_VTT - 0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&output_file_db);
  std::ios_base::~ios_base(aiStack_5c0);
  local_8b8 = uVar1;
  *(undefined8 *)((long)&local_8b8 + *(long *)(uVar1 - 0x18)) = uVar2;
  std::filebuf::~filebuf((filebuf *)&output_file_pb);
  std::ios_base::~ios_base(aiStack_7c0);
  local_4b8 = uVar1;
  *(undefined8 *)((long)&local_4b8 + *(long *)(uVar1 - 0x18)) = uVar2;
  std::filebuf::~filebuf((filebuf *)&output_file_da);
  std::ios_base::~ios_base(aiStack_3c0);
  local_2b8 = uVar1;
  *(undefined8 *)((long)&local_2b8 + *(long *)(uVar1 - 0x18)) = uVar2;
  std::filebuf::~filebuf((filebuf *)&output_file_pa);
  std::ios_base::~ios_base(aiStack_1c0);
  if (flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)pi_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (t != 0) {
    operator_delete((void *)t,
                    (long)flags_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - t);
  }
  if (flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)pi_p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)flags_d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void Helper::GenerateRandomPermutations(int n_p, int n_d, int count)
{
    std::vector<int> pi_p(n_p, 0), flags_p(n_p, 0);
    std::vector<int> pi_d(n_d, 0), flags_d(n_d, 0);
    std::ofstream output_file_pa("../randoms/alice/Permutations_PA.txt");
    std::ostream_iterator<int> output_iterator_pa(output_file_pa, " ");
    std::ofstream output_file_da("../randoms/alice/Permutations_DA.txt");
    std::ostream_iterator<int> output_iterator_da(output_file_da, " ");
    std::ofstream output_file_pb("../randoms/bob/Permutations_PB.txt");
    std::ostream_iterator<int> output_iterator_pb(output_file_pb, " ");
    std::ofstream output_file_db("../randoms/bob/Permutations_DB.txt");
    std::ostream_iterator<int> output_iterator_db(output_file_db, " ");
    time_t t;
    srand((unsigned)time(&t));

    for (int j = 0; j < 2 * count; j++)
    {
        for (int i = 0, r = 0; i < n_p;)
        {
            r = rand() % n_p;
            if (flags_p[r] == 0)
            {
                flags_p[r] = 1;
                pi_p[i] = r;
                // std::cout << r << " ";
                i++;
            }
        }
        // std::cout << "\n";
        for (int i = 0, r = 0; i < n_d;)
        {
            r = rand() % n_d;
            if (flags_d[r] == 0)
            {
                flags_d[r] = 1;
                pi_d[i] = r;
                // std::cout << r << " ";
                i++;
            }
        }
        // std::cout << "\n";
        if (j % 2 == 0)
        {
            std::copy(pi_p.begin(), pi_p.end(), output_iterator_pa);
            std::copy(pi_d.begin(), pi_d.end(), output_iterator_da);
            output_file_pa << std::endl;
            output_file_da << std::endl;
            output_file_pa.flush();
            output_file_da.flush();
        }
        else
        {
            std::copy(pi_p.begin(), pi_p.end(), output_iterator_pb);
            std::copy(pi_d.begin(), pi_d.end(), output_iterator_db);
            output_file_pb << std::endl;
            output_file_db << std::endl;
            output_file_pb.flush();
            output_file_db.flush();
        }
        std::fill(flags_p.begin(), flags_p.end(), 0);
        std::fill(flags_d.begin(), flags_d.end(), 0);
    }
    output_file_pa.close();
    output_file_da.close();
    output_file_pb.close();
    output_file_db.close();
}